

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

uint * vector_sum(uint *a,uint a_len,uint *b,uint b_len,uint *new_len)

{
  uint *puVar1;
  ulong uVar2;
  
  if (a_len == b_len) {
    puVar1 = (uint *)calloc((ulong)a_len,4);
    if (new_len != (uint *)0x0) {
      *new_len = a_len;
    }
    if (a_len != 0) {
      uVar2 = 0;
      do {
        puVar1[uVar2] = b[uVar2] + a[uVar2];
        uVar2 = uVar2 + 1;
      } while (a_len != uVar2);
    }
    return puVar1;
  }
  vector_sum_cold_1();
  puVar1 = (uint *)calloc((ulong)(a_len + 1),1);
  if (a_len != 0) {
    uVar2 = 0;
    do {
      *(char *)((long)puVar1 + uVar2) = (char)a[uVar2];
      uVar2 = uVar2 + 1;
    } while (a_len != uVar2);
  }
  return puVar1;
}

Assistant:

uint32_t *vector_sum(uint32_t *a, uint32_t a_len, uint32_t *b, uint32_t b_len, uint32_t *new_len)
{
    if (a_len != b_len)
        fatal("vector_sum", "a_len should be equal to b_len\n");

    uint32_t *c = vector_new(a_len);

    if (new_len != NULL)
        *new_len = a_len;

    for (uint32_t i = 0; i < a_len; i++)
        c[i] = a[i] + b[i];
    return c;
}